

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O3

Ivy_Obj_t *
Ivy_NodeBalanceBuildSuper(Ivy_Man_t *p,Vec_Ptr_t *vSuper,Ivy_Type_t Type,int fUpdateLevel)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  void *pvVar3;
  bool bVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  void **ppvVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  Ivy_Obj_t *pIVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  
  if ((long)vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyBalance.c"
                  ,0xb3,
                  "Ivy_Obj_t *Ivy_NodeBalanceBuildSuper(Ivy_Man_t *, Vec_Ptr_t *, Ivy_Type_t, int)")
    ;
  }
  qsort(vSuper->pArray,(long)vSuper->nSize,8,Ivy_NodeCompareLevelsDecrease);
  uVar14 = vSuper->nSize;
  uVar15 = (ulong)uVar14;
  if (1 < (int)uVar14) {
    do {
      uVar10 = 0;
      uVar14 = (uint)uVar15;
      if ((fUpdateLevel != 0) && (uVar10 = 0, uVar14 != 2)) {
        ppvVar7 = vSuper->pArray;
        uVar12 = *(uint *)(((ulong)ppvVar7[uVar15 - 2] & 0xfffffffffffffffe) + 8);
        uVar11 = (ulong)(uVar14 - 3) + 1;
        do {
          if (0x7ff < (*(uint *)(((ulong)ppvVar7[uVar11 - 1] & 0xfffffffffffffffe) + 8) ^ uVar12))
          goto LAB_0092791b;
          uVar16 = uVar11 - 1;
          bVar4 = 0 < (long)uVar11;
          uVar11 = uVar16;
        } while (uVar16 != 0 && bVar4);
        uVar11 = 0;
LAB_0092791b:
        uVar10 = (uint)uVar11;
        if (uVar14 <= uVar10) goto LAB_00927c16;
        if (0x7ff < (uVar12 ^ *(uint *)(((ulong)ppvVar7[uVar11 & 0xffffffff] & 0xfffffffffffffffe) +
                                       8))) {
          __assert_fail("Ivy_Regular(pObjLeft)->Level == Ivy_Regular(pObjRight)->Level",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyBalance.c"
                        ,0x13b,"int Ivy_NodeBalanceFindLeft(Vec_Ptr_t *)");
        }
      }
      uVar12 = uVar14 - 2;
      if ((int)uVar12 < (int)uVar10) {
        __assert_fail("LeftBound <= RightBound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyBalance.c"
                      ,0x151,"void Ivy_NodeBalancePermute(Ivy_Man_t *, Vec_Ptr_t *, int, int)");
      }
      if (uVar12 != uVar10) {
        pIVar6 = (Ivy_Obj_t *)vSuper->pArray[uVar15 - 1];
        pIVar13 = (Ivy_Obj_t *)((ulong)pIVar6 & 0xfffffffffffffffe);
        if (p->pConst1 != pIVar13) {
          pIVar1 = (Ivy_Obj_t *)vSuper->pArray[uVar12];
          uVar17 = uVar12;
          if (p->pConst1 != (Ivy_Obj_t *)((ulong)pIVar1 & 0xfffffffffffffffe)) {
            do {
              if (((int)uVar17 < 0) || (uVar14 = vSuper->nSize, (int)uVar14 <= (int)uVar17))
              goto LAB_00927c16;
              pIVar2 = (Ivy_Obj_t *)vSuper->pArray[uVar17];
              pIVar5 = (Ivy_Obj_t *)((ulong)pIVar2 & 0xfffffffffffffffe);
              if (p->pConst1 == pIVar5) {
                vSuper->pArray[uVar17] = pIVar1;
LAB_00927a9a:
                if ((int)uVar14 <= (int)uVar12) {
LAB_00927cef:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                vSuper->pArray[uVar12] = pIVar2;
                goto LAB_00927ab6;
              }
              if ((Type != IVY_EXOR) && (pIVar13->Id == 0)) {
                __assert_fail("Type != IVY_AND || !Ivy_ObjIsConst1(Ivy_Regular(p0))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                              ,0x137,
                              "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                             );
              }
              if (pIVar2 == (Ivy_Obj_t *)0x0) {
                pIVar5 = (Ivy_Obj_t *)0x0;
              }
              else if (pIVar5->Id == 0) {
                __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                              ,0x138,
                              "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                             );
              }
              if (pIVar13 == pIVar5) {
                __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                              ,0x139,
                              "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                             );
              }
              *(uint *)&(p->Ghost).field_0x8 =
                   (*(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0) + (Type == IVY_EXOR) + 5;
              (p->Ghost).pFanin0 = pIVar6;
              (p->Ghost).pFanin1 = pIVar2;
              if (pIVar2 != (Ivy_Obj_t *)0x0) {
                if (pIVar6 == (Ivy_Obj_t *)0x0) {
                  iVar9 = 0;
                }
                else {
                  iVar9 = pIVar13->Id;
                }
                if (pIVar5->Id < iVar9) {
                  (p->Ghost).pFanin0 = pIVar2;
                  (p->Ghost).pFanin1 = pIVar6;
                }
              }
              pIVar5 = Ivy_TableLookup(p,&p->Ghost);
              if (pIVar5 != (Ivy_Obj_t *)0x0) {
                uVar14 = vSuper->nSize;
                if (pIVar2 != pIVar1) {
                  if ((int)uVar14 <= (int)uVar17) goto LAB_00927cef;
                  vSuper->pArray[uVar17] = pIVar1;
                  goto LAB_00927a9a;
                }
                goto LAB_00927ab6;
              }
              bVar4 = (int)uVar10 < (int)uVar17;
              uVar17 = uVar17 - 1;
            } while (bVar4);
            uVar14 = vSuper->nSize;
          }
        }
      }
LAB_00927ab6:
      if ((int)uVar14 < 1) {
LAB_00927c54:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      uVar10 = uVar14 - 1;
      vSuper->nSize = uVar10;
      if (uVar10 == 0) goto LAB_00927c54;
      pIVar6 = (Ivy_Obj_t *)vSuper->pArray[uVar10];
      vSuper->nSize = uVar14 - 2;
      pIVar6 = Ivy_Oper(p,pIVar6,(Ivy_Obj_t *)vSuper->pArray[uVar14 - 2],Type);
      uVar14 = vSuper->nSize;
      uVar15 = (ulong)uVar14;
      if (0 < (int)uVar14) {
        uVar11 = 0;
        do {
          if ((Ivy_Obj_t *)vSuper->pArray[uVar11] == pIVar6) goto LAB_00927be1;
          uVar11 = uVar11 + 1;
        } while (uVar15 != uVar11);
      }
      if (uVar14 == vSuper->nCap) {
        if ((int)uVar14 < 0x10) {
          if (vSuper->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vSuper->pArray,0x80);
          }
          vSuper->pArray = ppvVar7;
          vSuper->nCap = 0x10;
        }
        else {
          if (vSuper->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(uVar15 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vSuper->pArray,uVar15 << 4);
          }
          vSuper->pArray = ppvVar7;
          vSuper->nCap = uVar14 * 2;
        }
      }
      else {
        ppvVar7 = vSuper->pArray;
      }
      uVar11 = (ulong)vSuper->nSize;
      uVar14 = vSuper->nSize + 1;
      uVar15 = (ulong)uVar14;
      vSuper->nSize = uVar14;
      ppvVar7[uVar11] = pIVar6;
      if ((long)uVar11 < 1) break;
      lVar8 = (ulong)uVar14 - 2;
      do {
        ppvVar7 = vSuper->pArray;
        pvVar3 = ppvVar7[uVar11 & 0xffffffff];
        if (*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8) >> 0xb <=
            *(uint *)(((ulong)ppvVar7[lVar8] & 0xfffffffffffffffe) + 8) >> 0xb) break;
        ppvVar7[uVar11 & 0xffffffff] = ppvVar7[lVar8];
        vSuper->pArray[lVar8] = pvVar3;
        iVar9 = (int)uVar11;
        uVar11 = (ulong)(iVar9 - 1);
        lVar8 = lVar8 + -1;
      } while (1 < iVar9);
LAB_00927be1:
      uVar14 = (uint)uVar15;
    } while (1 < (int)uVar14);
  }
  if (uVar14 == 1) {
    return (Ivy_Obj_t *)*vSuper->pArray;
  }
LAB_00927c16:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Ivy_Obj_t * Ivy_NodeBalanceBuildSuper( Ivy_Man_t * p, Vec_Ptr_t * vSuper, Ivy_Type_t Type, int fUpdateLevel )
{
    Ivy_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Ivy_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Ivy_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Ivy_NodeBalancePermute( p, vSuper, LeftBound, Type == IVY_EXOR );
        // pull out the last two nodes
        pObj1 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Ivy_Obj_t *)Vec_PtrPop(vSuper);
        Ivy_NodeBalancePushUniqueOrderByLevel( vSuper, Ivy_Oper(p, pObj1, pObj2, Type) );
    }
    return (Ivy_Obj_t *)Vec_PtrEntry(vSuper, 0);
}